

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void (anonymous_namespace)::miniz::tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  int *piVar1;
  mz_uint16 mVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ushort *puVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ushort *puVar14;
  int iVar15;
  ushort *puVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint *__s;
  int num_codes [33];
  mz_uint next_code [33];
  tdefl_sym_freq syms0 [288];
  tdefl_sym_freq syms1 [288];
  int local_15c8 [36];
  uint local_1538 [256];
  uint local_1138 [256];
  ushort local_d38 [576];
  uint auStack_8b8 [256];
  ushort local_4b8 [580];
  
  uVar13 = 0;
  memset(local_15c8,0,0x84);
  uVar21 = (ulong)(uint)table_len;
  if (static_table == 0) {
    if (0 < table_len) {
      uVar6 = 0;
      uVar13 = 0;
      do {
        mVar2 = d->m_huff_count[(uint)table_num][uVar6];
        if (mVar2 != 0) {
          lVar8 = (long)(int)uVar13;
          *(mz_uint16 *)(auStack_8b8 + lVar8 + -0x120) = mVar2;
          uVar13 = uVar13 + 1;
          *(short *)((long)auStack_8b8 + lVar8 * 4 + -0x47e) = (short)uVar6;
        }
        uVar6 = uVar6 + 1;
      } while (uVar21 != uVar6);
    }
    __s = local_1538;
    memset(__s,0,0x800);
    uVar6 = (ulong)uVar13;
    if (uVar13 != 0) {
      uVar7 = 0;
      do {
        uVar18 = auStack_8b8[uVar7 - 0x120];
        local_1538[(byte)(ushort)uVar18] = local_1538[(byte)(ushort)uVar18] + 1;
        piVar1 = (int *)((long)local_1138 + (ulong)((ushort)((ushort)uVar18 >> 6) & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    lVar8 = 2;
    bVar3 = local_1138[0] == uVar13;
    do {
      bVar10 = bVar3;
      lVar20 = lVar8;
      bVar4 = 0;
      lVar8 = 1;
      bVar3 = false;
    } while (bVar10);
    lVar8 = 0;
    puVar14 = local_d38;
    puVar9 = local_4b8;
    do {
      puVar16 = puVar9;
      puVar9 = puVar14;
      lVar17 = 0;
      uVar18 = 0;
      do {
        auStack_8b8[lVar17] = uVar18;
        uVar18 = uVar18 + __s[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x100);
      if (uVar13 != 0) {
        uVar7 = 0;
        do {
          uVar19 = puVar9[uVar7 * 2] >> (bVar4 & 0x1f) & 0xff;
          uVar18 = auStack_8b8[uVar19];
          auStack_8b8[uVar19] = uVar18 + 1;
          *(undefined4 *)(puVar16 + (ulong)uVar18 * 2) = *(undefined4 *)(puVar9 + uVar7 * 2);
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      lVar8 = lVar8 + 1;
      bVar4 = bVar4 + 8;
      __s = __s + 0x100;
      puVar14 = puVar16;
    } while (lVar8 != lVar20);
    if (uVar13 != 0) {
      if (uVar13 == 1) {
        *puVar16 = 1;
      }
      else {
        *puVar16 = *puVar16 + puVar16[2];
        uVar18 = uVar13 - 1;
        if (2 < (int)uVar13) {
          iVar11 = 0;
          iVar5 = 2;
          uVar7 = 1;
          do {
            lVar8 = (long)iVar11;
            if ((iVar5 < (int)uVar13) &&
               (lVar20 = (long)iVar5, puVar16[lVar20 * 2] <= puVar16[lVar8 * 2])) {
              iVar5 = iVar5 + 1;
              puVar16[uVar7 * 2] = puVar16[lVar20 * 2];
            }
            else {
              puVar16[uVar7 * 2] = puVar16[lVar8 * 2];
              iVar11 = iVar11 + 1;
              puVar16[lVar8 * 2] = (ushort)uVar7;
            }
            lVar8 = (long)iVar11;
            if ((iVar5 < (int)uVar13) &&
               ((lVar20 = (long)iVar5, (long)uVar7 <= lVar8 ||
                (puVar16[lVar20 * 2] <= puVar16[lVar8 * 2])))) {
              iVar5 = iVar5 + 1;
              puVar16[uVar7 * 2] = puVar16[uVar7 * 2] + puVar16[lVar20 * 2];
            }
            else {
              puVar16[uVar7 * 2] = puVar16[uVar7 * 2] + puVar16[lVar8 * 2];
              iVar11 = iVar11 + 1;
              puVar16[lVar8 * 2] = (ushort)uVar7;
            }
            uVar7 = uVar7 + 1;
          } while (uVar18 != uVar7);
        }
        puVar16[(long)(int)uVar13 * 2 + -4] = 0;
        if (2 < (int)uVar13) {
          lVar8 = (ulong)(uVar13 - 3) + 1;
          do {
            puVar16[lVar8 * 2 + -2] = puVar16[(ulong)puVar16[lVar8 * 2 + -2] * 2] + 1;
            lVar20 = lVar8 + -1;
            bVar3 = 0 < lVar8;
            lVar8 = lVar20;
          } while (lVar20 != 0 && bVar3);
        }
        uVar7 = (ulong)(uVar13 - 2);
        iVar5 = 1;
        uVar19 = 0;
        do {
          if ((int)uVar7 < 0) {
            iVar11 = 0;
          }
          else {
            iVar15 = (int)uVar7 + 1;
            iVar11 = 0;
            do {
              if (uVar19 != puVar16[uVar7 * 2]) goto LAB_001a7ea2;
              iVar11 = iVar11 + 1;
              uVar7 = (ulong)((int)uVar7 - 1);
            } while (iVar15 != iVar11);
            uVar7 = 0xffffffff;
            iVar11 = iVar15;
          }
LAB_001a7ea2:
          if (iVar11 < iVar5) {
            puVar14 = puVar16 + (long)(int)uVar18 * 2;
            uVar18 = (uVar18 + iVar11) - iVar5;
            do {
              *puVar14 = (ushort)uVar19;
              iVar5 = iVar5 + -1;
              puVar14 = puVar14 + -2;
            } while (iVar11 < iVar5);
          }
          iVar5 = iVar11 * 2;
          uVar19 = uVar19 + 1;
        } while (iVar11 != 0);
      }
    }
    if (0 < (int)uVar13) {
      uVar7 = 0;
      do {
        local_15c8[puVar16[uVar7 * 2]] = local_15c8[puVar16[uVar7 * 2]] + 1;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    if (1 < (int)uVar13) {
      if (code_size_limit < 0x20) {
        iVar5 = local_15c8[(uint)code_size_limit];
        lVar8 = (long)code_size_limit;
        do {
          iVar5 = iVar5 + local_15c8[lVar8 + 1];
          lVar8 = lVar8 + 1;
          local_15c8[(uint)code_size_limit] = iVar5;
        } while (lVar8 != 0x20);
      }
      if (code_size_limit < 1) {
        uVar6 = 0;
      }
      else {
        lVar8 = (ulong)(uint)code_size_limit + 1;
        bVar4 = 0;
        uVar6 = 0;
        do {
          uVar6 = (ulong)(uint)((int)uVar6 + (local_15c8[lVar8 + -1] << (bVar4 & 0x1f)));
          lVar8 = lVar8 + -1;
          bVar4 = bVar4 + 1;
        } while (1 < lVar8);
      }
      uVar7 = 1L << ((byte)code_size_limit & 0x3f);
      if (uVar7 != uVar6) {
        do {
          local_15c8[(uint)code_size_limit] = local_15c8[(uint)code_size_limit] + -1;
          uVar12 = (ulong)(uint)code_size_limit;
          do {
            if ((int)uVar12 < 2) goto LAB_001a7f7c;
            lVar8 = uVar12 - 1;
            uVar12 = uVar12 - 1;
          } while (local_15c8[lVar8] == 0);
          local_15c8[uVar12] = local_15c8[lVar8] + -1;
          local_15c8[(int)uVar12 + 1U & 0x7fffffff] = local_15c8[(int)uVar12 + 1U & 0x7fffffff] + 2;
LAB_001a7f7c:
          uVar6 = (ulong)((int)uVar6 - 1);
        } while (uVar7 != uVar6);
      }
    }
    memset(d->m_huff_code_sizes + (uint)table_num,0,0x120);
    memset(d->m_huff_codes + (uint)table_num,0,0x240);
    if (0 < code_size_limit) {
      uVar6 = 1;
      do {
        iVar5 = local_15c8[uVar6];
        if (0 < iVar5) {
          puVar14 = puVar16 + (long)(int)uVar13 * 2 + -1;
          uVar13 = uVar13 - iVar5;
          iVar5 = iVar5 + 1;
          do {
            d->m_huff_code_sizes[(uint)table_num][*puVar14] = (mz_uint8)uVar6;
            puVar14 = puVar14 + -2;
            iVar5 = iVar5 + -1;
          } while (1 < iVar5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != code_size_limit + 1);
    }
  }
  else if (0 < table_len) {
    uVar6 = 0;
    do {
      local_15c8[d->m_huff_code_sizes[(uint)table_num][uVar6]] =
           local_15c8[d->m_huff_code_sizes[(uint)table_num][uVar6]] + 1;
      uVar6 = uVar6 + 1;
    } while (uVar21 != uVar6);
  }
  local_1538[1] = 0;
  if (1 < code_size_limit) {
    lVar8 = 0;
    uVar13 = 0;
    do {
      uVar13 = (uVar13 + local_15c8[lVar8 + 1]) * 2;
      local_1538[lVar8 + 2] = uVar13;
      lVar8 = lVar8 + 1;
    } while ((ulong)(uint)code_size_limit - 1 != lVar8);
  }
  if (0 < table_len) {
    uVar6 = 0;
    do {
      bVar4 = d->m_huff_code_sizes[(uint)table_num][uVar6];
      if (bVar4 != 0) {
        uVar18 = (uint)bVar4;
        uVar13 = local_1538[uVar18];
        local_1538[uVar18] = uVar13 + 1;
        iVar11 = uVar18 + 1;
        iVar5 = 0;
        do {
          iVar5 = (uVar13 & 1) + iVar5 * 2;
          uVar13 = uVar13 >> 1;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
        d->m_huff_codes[(uint)table_num][uVar6] = (mz_uint16)iVar5;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar21);
  }
  return;
}

Assistant:

static void tdefl_optimize_huffman_table(tdefl_compressor *d, int table_num,
                                         int table_len, int code_size_limit,
                                         int static_table) {
  int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
  mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
  MZ_CLEAR_OBJ(num_codes);
  if (static_table) {
    for (i = 0; i < table_len; i++)
      num_codes[d->m_huff_code_sizes[table_num][i]]++;
  } else {
    tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS],
        *pSyms;
    int num_used_syms = 0;
    const mz_uint16 *pSym_count = &d->m_huff_count[table_num][0];
    for (i = 0; i < table_len; i++)
      if (pSym_count[i]) {
        syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
        syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
      }

    pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
    tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

    for (i = 0; i < num_used_syms; i++)
      num_codes[pSyms[i].m_key]++;

    tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms,
                                        code_size_limit);

    MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
    MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
    for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
      for (l = num_codes[i]; l > 0; l--)
        d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
  }

  next_code[1] = 0;
  for (j = 0, i = 2; i <= code_size_limit; i++)
    next_code[i] = j = ((j + num_codes[i - 1]) << 1);

  for (i = 0; i < table_len; i++) {
    mz_uint rev_code = 0, code, code_size;
    if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
      continue;
    code = next_code[code_size]++;
    for (l = code_size; l > 0; l--, code >>= 1)
      rev_code = (rev_code << 1) | (code & 1);
    d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
  }
}